

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

AspifTextOutput * __thiscall
Potassco::AspifTextOutput::push(AspifTextOutput *this,WeightLitSpan *wlits)

{
  Data *this_00;
  WeightLit_t *pWVar1;
  long lVar2;
  uint local_34;
  uint local_30;
  uint local_2c;
  
  this_00 = this->data_;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::reserve
            (&this_00->directives,
             ((long)(this_00->directives).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              (long)(this_00->directives).
                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                    super__Vector_impl_data._M_start >> 2) + wlits->size * 2);
  local_2c = (uint)wlits->size;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
            (&this->data_->directives,&local_2c);
  pWVar1 = wlits->first;
  for (lVar2 = wlits->size << 3; lVar2 != 0; lVar2 = lVar2 + -8) {
    local_30 = pWVar1->lit;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->data_->directives,&local_30);
    local_34 = pWVar1->weight;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->data_->directives,&local_34);
    pWVar1 = pWVar1 + 1;
  }
  return this;
}

Assistant:

AspifTextOutput& AspifTextOutput::push(const WeightLitSpan& wlits) {
	data_->directives.reserve(data_->directives.size() + (2*size(wlits)));
	data_->directives.push_back(static_cast<uint32_t>(size(wlits)));
	for (WeightLitSpan::iterator it = begin(wlits), end = Potassco::end(wlits); it != end; ++it) {
		data_->directives.push_back(static_cast<uint32_t>(lit(*it)));
		data_->directives.push_back(static_cast<uint32_t>(weight(*it)));
	}
	return *this;
}